

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O1

int lj_cf_jit_prngstate(lua_State *L)

{
  ulong uVar1;
  double dVar2;
  uint64_t uVar3;
  MSize MVar4;
  GCtab *t;
  TValue *pTVar5;
  GCtab *t_00;
  cTValue *pcVar6;
  long lVar7;
  int32_t key;
  uint uVar8;
  ulong uVar9;
  PRNGState prng;
  ulong local_50 [4];
  
  t = lj_tab_new(L,8,0);
  uVar3 = (L->glref).ptr64;
  lVar7 = 0x10;
  uVar9 = 0;
  do {
    if (uVar9 + 1 < (ulong)t->asize) {
      pTVar5 = (TValue *)((t->array).ptr64 + lVar7 + -8);
    }
    else {
      pTVar5 = lj_tab_setinth(L,t,(int)uVar9 + 1);
    }
    uVar1 = uVar9 + 2;
    pTVar5->n = (double)*(int *)(uVar3 + 0xf08 + uVar9 * 4);
    if (uVar1 < t->asize) {
      pTVar5 = (TValue *)((t->array).ptr64 + lVar7);
    }
    else {
      pTVar5 = lj_tab_setinth(L,t,(int)uVar9 + 2);
    }
    pTVar5->n = (double)*(int *)(uVar3 + 0xf0c + uVar9 * 4);
    lVar7 = lVar7 + 0x10;
    uVar9 = uVar1;
  } while (uVar1 != 8);
  pTVar5 = L->base;
  if ((pTVar5 < L->top) &&
     (pTVar5->field_4 != (anon_struct_8_2_7fa0a05d_for_TValue_4)0xffffffffffffffff)) {
    if ((pTVar5->field_4).it >> 0xf < 0x1fff3) {
      dVar2 = pTVar5->n;
      if ((dVar2 != (double)((long)dVar2 & 0xffffffff)) ||
         (NAN(dVar2) || NAN((double)((long)dVar2 & 0xffffffff)))) {
LAB_0015c4bf:
        lj_err_arg(L,1,LJ_ERR_PRNGSTATE);
      }
      local_50[0] = (ulong)(int)dVar2;
      local_50[1] = 0;
      local_50[2] = 0;
      local_50[3] = 0;
    }
    else {
      uVar9 = 1;
      t_00 = lj_lib_checktab(L,1);
      MVar4 = lj_tab_len(t_00);
      if (8 < (int)MVar4) goto LAB_0015c4bf;
      if (0 < (int)MVar4) {
        uVar9 = 1;
        do {
          key = (int32_t)uVar9;
          if (uVar9 < t_00->asize) {
            pcVar6 = (cTValue *)(uVar9 * 8 + (t_00->array).ptr64);
          }
          else {
            pcVar6 = lj_tab_getinth(t_00,key);
          }
          if (0xfff8 < *(ushort *)((long)&(pcVar6->gcr).gcptr64 + 6)) goto LAB_0015c4bf;
          dVar2 = pcVar6->n;
          if ((dVar2 != (double)((long)dVar2 & 0xffffffff)) ||
             (NAN(dVar2) || NAN((double)((long)dVar2 & 0xffffffff)))) goto LAB_0015c4bf;
          if ((uVar9 & 1) == 0) {
            local_50[key - 1U >> 1] = local_50[key - 1U >> 1] | (ulong)(uint)(int)dVar2 << 0x20;
          }
          else {
            local_50[key - 1U >> 1] = (long)(int)dVar2;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != MVar4 + 1);
      }
      if ((uint)uVar9 < 8) {
        uVar8 = ((uint)uVar9 & 6) << 2;
        memset((void *)((long)local_50 + (ulong)uVar8),0,(ulong)((uVar8 ^ 0x18) + 8));
      }
    }
    *(ulong *)(uVar3 + 0xf18) = local_50[2];
    *(ulong *)(uVar3 + 0xf20) = local_50[3];
    *(ulong *)(uVar3 + 0xf08) = local_50[0];
    *(ulong *)(uVar3 + 0xf10) = local_50[1];
  }
  pTVar5 = L->top;
  L->top = pTVar5 + 1;
  pTVar5->u64 = (ulong)t | 0xfffa000000000000;
  return 1;
}

Assistant:

LJLIB_CF(jit_prngstate)
{
  GCtab *cur = lj_tab_new(L, 8, 0);

#if LJ_HASJIT
  int i;
  jit_State *J = L2J(L);

  /* The old state. */
  for (i = 1; i <= 4; i++) {
    setintV(lj_tab_setint(L, cur, i*2-1), J->prng.u[i-1] & 0xffffffff);
    setintV(lj_tab_setint(L, cur, i*2), J->prng.u[i-1] >> 32);
  }

  /* We need to set new state using the input array. */
  if (L->base < L->top && !tvisnil(L->base)) {
    PRNGState prng;
    if (tvisnumber(L->base)) {
      TValue *o = L->base;

      if (!tvisint(o) && ((double)(uint32_t)numV(o) != numV(o)))
        lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

      prng.u[0] = numberVint(o);
      for (i = 1; i < 4; i++)
        prng.u[i] = 0;
    } else {
      GCtab *t = lj_lib_checktab(L, 1);
      int i = 1, len = lj_tab_len(t);

      /* The input array must have at most 8 elements. */
      if (len > 8)
        lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

      for (i = 1; i <= len; i++) {
        cTValue *v = lj_tab_getint(t, i);

        if (!tvisint(v) && (!tvisnum(v) || (double)(uint32_t)numV(v) != numV(v)))
          lj_err_arg(L, 1, LJ_ERR_PRNGSTATE);

        if (i & 1)
          prng.u[(i-1)/2] = numberVint(v);
        else
          prng.u[(i-1)/2] = prng.u[(i-1)/2] | ((uint64_t)numberVint(v) << 32);
      }
      for (i /= 2; i < 4; i++)
        prng.u[i] = 0;
    }

    /* Re-initialize the JIT prng. */
    J->prng = prng;
  }
#else
  for (int i = 1; i <= 8; i++)
    setintV(lj_tab_setint(L, cur, i), 0);
#endif
  settabV(L, L->top++, cur);
  return 1;
}